

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O2

void __thiscall OSTEI_VRR_Algorithm_Base::Create(OSTEI_VRR_Algorithm_Base *this,QuartetSet *q)

{
  IdxOrder idx_order_00;
  int i;
  long lVar1;
  _Base_ptr p_Var2;
  int iVar3;
  QuartetSet *__range1;
  IdxOrder idx_order;
  int local_b8 [4];
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [8];
  undefined8 uStack_90;
  QAM aml;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [8];
  undefined8 uStack_38;
  
  std::__cxx11::string::string((string *)&local_50,"",(allocator *)&aml);
  local_a8 = local_98;
  local_b8[0] = 0;
  local_b8[1] = 0;
  local_b8[2] = 0;
  local_b8[3] = 0;
  if (local_50 == local_40) {
    uStack_90 = uStack_38;
  }
  else {
    local_a8 = local_50;
  }
  local_a0 = local_48;
  local_48 = 0;
  local_40[0] = 0;
  local_50 = local_40;
  std::__cxx11::string::~string((string *)&local_50);
  for (p_Var2 = (q->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(q->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    Quartet::amlist(&aml,(Quartet *)(p_Var2 + 1));
    for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
      iVar3 = aml.qam._M_elems[lVar1];
      if (iVar3 < local_b8[lVar1]) {
        iVar3 = local_b8[lVar1];
      }
      local_b8[lVar1] = iVar3;
    }
    std::__cxx11::string::~string((string *)&aml.tag);
  }
  idx_order._M_elems[0] = 3;
  idx_order._M_elems[1] = 2;
  idx_order._M_elems[2] = 1;
  idx_order._M_elems[3] = 0;
  std::_Temporary_buffer<int_*,_int>::_Temporary_buffer
            ((_Temporary_buffer<int_*,_int> *)&aml,idx_order._M_elems,2);
  if (aml.tag._M_dataplus._M_p == (pointer)0x0) {
    std::
    __insertion_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<OSTEI_VRR_Algorithm_Base::Create(std::set<Quartet,std::less<Quartet>,std::allocator<Quartet>>const&)::__0>>
              (idx_order._M_elems,local_b8,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simint_chem[P]simint_generator_generator_ostei_OSTEI_VRR_Algorithm_Base_cpp:466:22)>
                )local_b8);
  }
  else {
    std::
    __stable_sort_adaptive<int*,int*,long,__gnu_cxx::__ops::_Iter_comp_iter<OSTEI_VRR_Algorithm_Base::Create(std::set<Quartet,std::less<Quartet>,std::allocator<Quartet>>const&)::__0>>
              (idx_order._M_elems,local_b8,(int *)aml.tag._M_dataplus._M_p,aml.qam._M_elems._8_8_,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simint_chem[P]simint_generator_generator_ostei_OSTEI_VRR_Algorithm_Base_cpp:466:22)>
                )local_b8);
  }
  operator_delete(aml.tag._M_dataplus._M_p);
  idx_order_00._M_elems[2] = idx_order._M_elems[2];
  idx_order_00._M_elems[3] = idx_order._M_elems[3];
  idx_order_00._M_elems[0] = idx_order._M_elems[0];
  idx_order_00._M_elems[1] = idx_order._M_elems[1];
  Create_WithOrder(this,q,idx_order_00);
  std::__cxx11::string::~string((string *)&local_a8);
  return;
}

Assistant:

void OSTEI_VRR_Algorithm_Base::Create(const QuartetSet & q)
{
    // Find where the lowest AM is first. This is our initial RR
    QAM qam_max{0,0,0,0};
    for(const Quartet & iq : q)
    {
        QAM aml = iq.amlist();
        for(int i = 0; i < 4; i++)
            qam_max[i] = std::max(qam_max[i], aml[i]);
    }


    // reversed, so we end up with a more "traditional" order
    // (ie, form dsss, then dsps).
    IdxOrder idx_order{3, 2, 1, 0}; 

    std::stable_sort(idx_order.begin(), idx_order.end(),
                     [ & qam_max ] ( int i, int j ) { return qam_max[i] < qam_max[j]; });

    Create_WithOrder(q, idx_order);
}